

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O2

void CMU462::Collada::ColladaWriter::writeGeometry(ofstream *out,Scene *scene)

{
  ostream *poVar1;
  Mesh *mesh;
  _Base_ptr p_Var2;
  int id;
  
  poVar1 = std::operator<<((ostream *)out,"   <library_geometries>");
  std::endl<char,std::char_traits<char>>(poVar1);
  id = 0;
  for (p_Var2 = (scene->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(scene->objects)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    if (*(long *)(p_Var2 + 1) != 0) {
      mesh = (Mesh *)__dynamic_cast(*(long *)(p_Var2 + 1),&DynamicScene::SceneObject::typeinfo,
                                    &DynamicScene::Mesh::typeinfo,0);
      if (mesh != (Mesh *)0x0) {
        id = id + 1;
        writeMesh(out,mesh,id);
      }
    }
  }
  poVar1 = std::operator<<((ostream *)out,"   </library_geometries>");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void ColladaWriter::writeGeometry( ofstream& out, DynamicScene::Scene& scene )
{
   int nMeshes = 0;

   out << "   <library_geometries>" << endl;
   for( auto o : scene.objects )
   {
      DynamicScene::Mesh* mesh = dynamic_cast<DynamicScene::Mesh*>( o );
      if( mesh )
      {
         nMeshes++;
         writeMesh( out, mesh, nMeshes );
      }

   }
   out << "   </library_geometries>" << endl;
}